

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QSynth.cpp
# Opt level: O2

int __thiscall QSynth::open(QSynth *this,char *__file,int __oflag,...)

{
  ROMImage **controlROMImage;
  ROMImage **pcmROMImage;
  double dVar1;
  uint *puVar2;
  bool bVar3;
  AnalogOutputMode AVar4;
  int iVar5;
  uint uVar6;
  Master *pMVar7;
  ROMImage *pRVar8;
  QDebug *pQVar9;
  SampleRateConverter *this_00;
  QString *in_RCX;
  undefined8 unaff_RBP;
  ulong uVar10;
  char *t;
  QDebug QStack_1b8;
  uint *local_1b0;
  SamplerateConversionQuality local_1a4;
  QArrayDataPointer<char16_t> local_1a0;
  undefined4 local_188;
  undefined8 local_184;
  undefined8 uStack_17c;
  undefined4 local_174;
  char *local_170;
  QArrayDataPointer<char16_t> local_168;
  QArrayDataPointer<char16_t> local_150;
  QArrayDataPointer<char16_t> local_138;
  QArrayDataPointer<char16_t> local_120;
  QArrayDataPointer<char16_t> local_108;
  QArrayDataPointer<char16_t> local_f0;
  SynthProfile synthProfile;
  
  iVar5 = (int)CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
  if (this->state != SynthState_OPEN) {
    local_1b0 = (uint *)__file;
    local_1a4 = __oflag;
    if ((in_RCX->d).size != 0) {
      QString::operator=(&this->synthProfileName,in_RCX);
    }
    SynthProfile::SynthProfile(&synthProfile);
    controlROMImage = &this->controlROMImage;
    pcmROMImage = &this->pcmROMImage;
    do {
      pMVar7 = Master::getInstance();
      local_150.d = (this->synthProfileName).d.d;
      local_150.ptr = (this->synthProfileName).d.ptr;
      local_150.size = (this->synthProfileName).d.size;
      if (local_150.d != (Data *)0x0) {
        LOCK();
        ((local_150.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_150.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      Master::loadSynthProfile(pMVar7,&synthProfile,(QString *)&local_150);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_150);
      if ((*controlROMImage != (ROMImage *)0x0) && (*pcmROMImage != (ROMImage *)0x0)) {
LAB_001378fe:
        AVar4 = MT32Emu::SampleRateConverter::getBestAnalogOutputMode((double)*local_1b0);
        uVar10 = 3;
        if (AVar4 != AnalogOutputMode_OVERSAMPLED ||
            synthProfile.analogOutputMode != AnalogOutputMode_ACCURATE) {
          uVar10 = (ulong)synthProfile.analogOutputMode;
        }
        setRendererType(this,synthProfile.rendererType);
        local_188 = 2;
        local_184 = 0;
        uStack_17c = 0;
        local_174 = 0;
        local_170 = "default";
        QMessageLogger::debug();
        pQVar9 = QDebug::operator<<(&QStack_1b8,"Using Analogue output mode:");
        puVar2 = local_1b0;
        QDebug::operator<<(pQVar9,_ZZN6QSynth4openERjN7MT32Emu27SamplerateConversionQualityE7QStringE19ANALOG_OUTPUT_MODES_rel
                                  + *(int *)(
                                            _ZZN6QSynth4openERjN7MT32Emu27SamplerateConversionQualityE7QStringE19ANALOG_OUTPUT_MODES_rel
                                            + uVar10 * 4));
        QDebug::~QDebug(&QStack_1b8);
        local_188 = 2;
        local_184 = 0;
        uStack_17c = 0;
        local_174 = 0;
        local_170 = "default";
        QMessageLogger::debug();
        pQVar9 = QDebug::operator<<(&QStack_1b8,"Using Renderer Type:");
        t = "Float 32-bit";
        if (synthProfile.rendererType == RendererType_BIT16S) {
          t = "Integer 16-bit";
        }
        QDebug::operator<<(pQVar9,t);
        QDebug::~QDebug(&QStack_1b8);
        local_188 = 2;
        local_184 = 0;
        uStack_17c = 0;
        local_174 = 0;
        local_170 = "default";
        QMessageLogger::debug();
        pQVar9 = QDebug::operator<<(&QStack_1b8,"Using Max Partials:");
        QDebug::operator<<(pQVar9,synthProfile.partialCount);
        QDebug::~QDebug(&QStack_1b8);
        dVar1 = MT32Emu::SampleRateConverter::getSupportedOutputSampleRate((double)*puVar2);
        *local_1b0 = (uint)(long)dVar1;
        iVar5 = MT32Emu::Synth::open
                          (this->synth,(char *)this->controlROMImage,(int)this->pcmROMImage,
                           (ulong)(uint)synthProfile.partialCount,uVar10);
        if ((char)iVar5 != '\0') {
          setState(this,SynthState_OPEN);
          QReportHandler::onDeviceReconfig(&this->reportHandler);
          local_1a0.d = (this->synthProfileName).d.d;
          local_1a0.ptr = (this->synthProfileName).d.ptr;
          local_1a0.size = (this->synthProfileName).d.size;
          if (local_1a0.d != (Data *)0x0) {
            LOCK();
            ((local_1a0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_1a0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          setSynthProfile(this,&synthProfile,(QString *)&local_1a0);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1a0);
          if (this->engageChannel1OnOpen == true) {
            resetMIDIChannelsAssignment(this,true);
          }
          uVar6 = *local_1b0;
          if (uVar6 == 0) {
            uVar6 = getSynthSampleRate(this);
            *local_1b0 = uVar6;
          }
          this_00 = (SampleRateConverter *)operator_new(0x18);
          MT32Emu::SampleRateConverter::SampleRateConverter
                    (this_00,this->synth,(double)uVar6,local_1a4);
          this->sampleRateConverter = this_00;
          iVar5 = (int)CONCAT71((uint7)(uint3)(uVar6 >> 8),1);
          goto LAB_00137b70;
        }
        createSynth(this);
        setState(this,SynthState_CLOSED);
        freeROMImages(this);
        break;
      }
      pMVar7 = Master::getInstance();
      Master::findROMImages(pMVar7,&synthProfile,controlROMImage,pcmROMImage);
      if (*controlROMImage != (ROMImage *)0x0) {
LAB_001377b0:
        if (*pcmROMImage == (ROMImage *)0x0) {
          local_120.d = synthProfile.pcmROMFileName.d.d;
          local_120.ptr = synthProfile.pcmROMFileName.d.ptr;
          local_120.size = synthProfile.pcmROMFileName.d.size;
          if (synthProfile.pcmROMFileName.d.d != (Data *)0x0) {
            LOCK();
            ((synthProfile.pcmROMFileName.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i =
                 ((synthProfile.pcmROMFileName.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          local_138.d = synthProfile.pcmROMFileName2.d.d;
          local_138.ptr = synthProfile.pcmROMFileName2.d.ptr;
          local_138.size = synthProfile.pcmROMFileName2.d.size;
          if (synthProfile.pcmROMFileName2.d.d != (Data *)0x0) {
            LOCK();
            ((synthProfile.pcmROMFileName2.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i =
                 ((synthProfile.pcmROMFileName2.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          pRVar8 = makeROMImage(&synthProfile.romDir,(QString *)&local_120,(QString *)&local_138);
          *pcmROMImage = pRVar8;
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_138);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_120);
          if ((*controlROMImage == (ROMImage *)0x0) || (*pcmROMImage == (ROMImage *)0x0))
          goto LAB_00137851;
        }
        goto LAB_001378fe;
      }
      local_f0.d = synthProfile.controlROMFileName.d.d;
      local_f0.ptr = synthProfile.controlROMFileName.d.ptr;
      local_f0.size = synthProfile.controlROMFileName.d.size;
      if (synthProfile.controlROMFileName.d.d != (Data *)0x0) {
        LOCK();
        ((synthProfile.controlROMFileName.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i =
             ((synthProfile.controlROMFileName.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_108.d = synthProfile.controlROMFileName2.d.d;
      local_108.ptr = synthProfile.controlROMFileName2.d.ptr;
      local_108.size = synthProfile.controlROMFileName2.d.size;
      if (synthProfile.controlROMFileName2.d.d != (Data *)0x0) {
        LOCK();
        ((synthProfile.controlROMFileName2.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i =
             ((synthProfile.controlROMFileName2.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pRVar8 = makeROMImage(&synthProfile.romDir,(QString *)&local_f0,(QString *)&local_108);
      *controlROMImage = pRVar8;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f0);
      if (*controlROMImage != (ROMImage *)0x0) goto LAB_001377b0;
LAB_00137851:
      local_188 = 2;
      local_184 = 0;
      uStack_17c = 0;
      local_174 = 0;
      local_170 = "default";
      QMessageLogger::debug();
      QDebug::operator<<(&QStack_1b8,"Missing ROM files. Can\'t open synth :(");
      QDebug::~QDebug(&QStack_1b8);
      freeROMImages(this);
      pMVar7 = Master::getInstance();
      local_168.d = (this->synthProfileName).d.d;
      local_168.ptr = (this->synthProfileName).d.ptr;
      local_168.size = (this->synthProfileName).d.size;
      if (local_168.d != (Data *)0x0) {
        LOCK();
        ((local_168.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_168.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      bVar3 = Master::handleROMSLoadFailed(pMVar7,(QString *)&local_168);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_168);
    } while (bVar3);
    iVar5 = 0;
LAB_00137b70:
    SynthProfile::~SynthProfile(&synthProfile);
  }
  return iVar5;
}

Assistant:

bool QSynth::isOpen() const {
	return state == SynthState_OPEN;
}